

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8 * __thiscall google::protobuf::io::EpsCopyOutputStream::Next(EpsCopyOutputStream *this)

{
  uint8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  LogMessage *pLVar4;
  uint8 *puVar5;
  uint8 *local_68;
  void *data;
  LogFinisher local_2d;
  uint local_2c [2];
  int size;
  
  if (this->had_error_ == true) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&stack0xffffffffffffff98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/coded_stream.cc"
               ,0x314);
    pLVar4 = internal::LogMessage::operator<<
                       ((LogMessage *)&stack0xffffffffffffff98,"CHECK failed: !had_error_: ");
    internal::LogFinisher::operator=((LogFinisher *)local_2c,pLVar4);
    internal::LogMessage::~LogMessage((LogMessage *)&stack0xffffffffffffff98);
  }
  if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
    this->had_error_ = true;
  }
  else {
    puVar1 = this->end_;
    puVar5 = this->buffer_;
    if (this->buffer_end_ != (uint8 *)0x0) {
      memcpy(this->buffer_end_,puVar5,(long)puVar1 - (long)puVar5);
      do {
        iVar3 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])
                          (this->stream_,&stack0xffffffffffffff98,local_2c);
        if ((char)iVar3 == '\0') {
          this->had_error_ = true;
          goto LAB_00161d49;
        }
      } while ((ulong)local_2c[0] == 0);
      if (0x10 < (int)local_2c[0]) {
        uVar2 = *(undefined8 *)(this->end_ + 8);
        *(undefined8 *)local_68 = *(undefined8 *)this->end_;
        *(undefined8 *)(local_68 + 8) = uVar2;
        this->end_ = local_68 + ((ulong)local_2c[0] - 0x10);
        this->buffer_end_ = (uint8 *)0x0;
        return local_68;
      }
      if ((int)local_2c[0] < 1) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&stack0xffffffffffffff98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/coded_stream.cc"
                   ,0x32a);
        pLVar4 = internal::LogMessage::operator<<
                           ((LogMessage *)&stack0xffffffffffffff98,"CHECK failed: size > 0: ");
        internal::LogFinisher::operator=(&local_2d,pLVar4);
        internal::LogMessage::~LogMessage((LogMessage *)&stack0xffffffffffffff98);
      }
      uVar2 = *(undefined8 *)(this->end_ + 8);
      *(undefined8 *)puVar5 = *(undefined8 *)this->end_;
      *(undefined8 *)(this->buffer_ + 8) = uVar2;
      this->buffer_end_ = local_68;
      puVar5 = puVar5 + (int)local_2c[0];
      goto LAB_00161d4d;
    }
    uVar2 = *(undefined8 *)(puVar1 + 8);
    *(undefined8 *)puVar5 = *(undefined8 *)puVar1;
    *(undefined8 *)(this->buffer_ + 8) = uVar2;
    this->buffer_end_ = puVar1;
  }
LAB_00161d49:
  puVar5 = this->buffer_ + 0x10;
LAB_00161d4d:
  this->end_ = puVar5;
  return this->buffer_;
}

Assistant:

uint8* EpsCopyOutputStream::Next() {
  GOOGLE_DCHECK(!had_error_);  // NOLINT
  if (PROTOBUF_PREDICT_FALSE(stream_ == nullptr)) return Error();
  if (buffer_end_) {
    // We're in the patch buffer and need to fill up the previous buffer.
    std::memcpy(buffer_end_, buffer_, end_ - buffer_);
    uint8* ptr;
    int size;
    do {
      void* data;
      if (PROTOBUF_PREDICT_FALSE(!stream_->Next(&data, &size))) {
        // Stream has an error, we use the patch buffer to continue to be
        // able to write.
        return Error();
      }
      ptr = static_cast<uint8*>(data);
    } while (size == 0);
    if (PROTOBUF_PREDICT_TRUE(size > kSlopBytes)) {
      std::memcpy(ptr, end_, kSlopBytes);
      end_ = ptr + size - kSlopBytes;
      buffer_end_ = nullptr;
      return ptr;
    } else {
      GOOGLE_DCHECK(size > 0);  // NOLINT
      // Buffer to small
      std::memmove(buffer_, end_, kSlopBytes);
      buffer_end_ = ptr;
      end_ = buffer_ + size;
      return buffer_;
    }
  } else {
    std::memcpy(buffer_, end_, kSlopBytes);
    buffer_end_ = end_;
    end_ = buffer_ + kSlopBytes;
    return buffer_;
  }
}